

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O0

uint32 BigEndian(uint32 a)

{
  undefined4 local_c;
  uint32 a_local;
  
  if ((char)BigEndian::signature == '\x04') {
    local_c = a >> 0x18 | (a & 0xff0000) >> 8 | (a & 0xff00) << 8 | a << 0x18;
  }
  else {
    local_c = a;
    if ((char)BigEndian::signature != '\x01') {
      local_c = 0;
    }
  }
  return local_c;
}

Assistant:

inline uint32 BigEndian(uint32 a)
{
    static unsigned long signature= 0x01020304UL;
    if (4 == (unsigned char&)signature) // little endian
        return ((a & 0xFF000000) >> 24) | ((a & 0x00FF0000) >> 8) | ((a & 0xFF00) << 8) | ((a & 0xFF) << 24);
    if (1 == (unsigned char&)signature) // big endian
        return a;
    // Error here
    return 0;
}